

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O2

void __thiscall bandit::reporter::info::output_not_yet_shown_context_start_messages(info *this)

{
  int iVar1;
  int i;
  int iVar2;
  _Elt_pointer pcVar3;
  stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
  temp_stack;
  stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
  sStack_78;
  
  std::
  stack<bandit::reporter::info::context_info,std::deque<bandit::reporter::info::context_info,std::allocator<bandit::reporter::info::context_info>>>
  ::
  stack<std::deque<bandit::reporter::info::context_info,std::allocator<bandit::reporter::info::context_info>>,void>
            (&sStack_78);
  for (iVar2 = 0; iVar1 = this->not_yet_shown_, iVar2 < iVar1; iVar2 = iVar2 + 1) {
    pcVar3 = (this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pcVar3 == (this->context_stack_).c.
                  super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pcVar3 = (this->context_stack_).c.
               super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
    }
    std::
    deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
    ::push_back(&sStack_78.c,pcVar3 + -1);
    std::
    deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
    ::pop_back(&(this->context_stack_).c);
  }
  for (iVar2 = 0; iVar2 < iVar1; iVar2 = iVar2 + 1) {
    pcVar3 = sStack_78.c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (sStack_78.c.
        super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        sStack_78.c.
        super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pcVar3 = sStack_78.c.
               super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
    }
    std::
    deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
    ::push_back(&(this->context_stack_).c,pcVar3 + -1);
    output_context_start_message(this);
    std::
    deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
    ::pop_back(&sStack_78.c);
    iVar1 = this->not_yet_shown_;
  }
  this->not_yet_shown_ = 0;
  std::
  deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
  ::~deque(&sStack_78.c);
  return;
}

Assistant:

void output_not_yet_shown_context_start_messages() {
        std::stack<context_info> temp_stack;
        for (int i = 0; i < not_yet_shown_; ++i) {
          temp_stack.push(context_stack_.top());
          context_stack_.pop();
        }
        for (int i = 0; i < not_yet_shown_; ++i) {
          context_stack_.push(temp_stack.top());
          output_context_start_message();
          temp_stack.pop();
        }
        not_yet_shown_ = 0;
      }